

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<vector_brodnik<unsigned_char*>>
               (uchar **strings,size_t n,size_t depth,vector_brodnik<unsigned_char_*> *buckets)

{
  vector_brodnik<unsigned_char_*> *pvVar1;
  uchar **ppuVar2;
  size_t j;
  long *__ptr;
  long lVar3;
  size_t sVar4;
  uchar *puVar5;
  uint8_t *puVar6;
  pointer pppuVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  pointer pppuVar11;
  size_t __n;
  size_t j_1;
  long lVar12;
  long lVar13;
  byte bVar14;
  uchar **ppuVar15;
  uint i;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_brodnik<unsigned_char*>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    sVar17 = 0;
  }
  else {
    sVar17 = 0;
    ppuVar15 = strings;
    do {
      lVar3 = 0;
      do {
        puVar5 = ppuVar15[lVar3];
        if (puVar5 == (uchar *)0x0) goto LAB_00208098;
        if (puVar5[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar5[depth],puVar5[depth + 1]);
        }
        auStack_58[lVar3] = uVar8;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      lVar3 = 0;
      do {
        pvVar1 = buckets + auStack_58[lVar3];
        sVar4 = buckets[auStack_58[lVar3]]._left_in_block;
        if (sVar4 == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar1);
          sVar4 = pvVar1->_left_in_block;
        }
        puVar5 = ppuVar15[lVar3];
        ppuVar2 = pvVar1->_insertpos;
        pvVar1->_insertpos = ppuVar2 + 1;
        *ppuVar2 = puVar5;
        pvVar1->_left_in_block = sVar4 - 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      sVar17 = sVar17 + 0x10;
      ppuVar15 = ppuVar15 + 0x10;
    } while (sVar17 < (n & 0xfffffffffffffff0));
  }
  if (sVar17 < n) {
    do {
      puVar5 = strings[sVar17];
      if (puVar5 == (uchar *)0x0) {
LAB_00208098:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar5[depth] == '\0') {
        uVar10 = 0;
      }
      else {
        uVar10 = (ulong)CONCAT11(puVar5[depth],puVar5[depth + 1]);
      }
      pvVar1 = buckets + uVar10;
      sVar4 = buckets[uVar10]._left_in_block;
      if (sVar4 == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar1);
        sVar4 = pvVar1->_left_in_block;
        puVar5 = strings[sVar17];
      }
      ppuVar15 = pvVar1->_insertpos;
      pvVar1->_insertpos = ppuVar15 + 1;
      *ppuVar15 = puVar5;
      pvVar1->_left_in_block = sVar4 - 1;
      sVar17 = sVar17 + 1;
    } while (n != sVar17);
  }
  puVar6 = &buckets->_superblock;
  lVar3 = 0;
  do {
    __ptr[lVar3] = ((long)(2 << (*puVar6 & 0x1f)) -
                   ((ulong)*(ushort *)(puVar6 + -4) * *(size_t *)(puVar6 + -0xc) +
                   *(size_t *)(puVar6 + -0x14))) + -0x40;
    lVar3 = lVar3 + 1;
    puVar6 = puVar6 + 0x38;
  } while (lVar3 != 0x10000);
  lVar3 = 0;
  lVar9 = 0;
  do {
    if (__ptr[lVar3] != 0) {
      pvVar1 = buckets + lVar3;
      ppuVar15 = strings + lVar9;
      pppuVar11 = buckets[lVar3]._index_block.
                  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pppuVar7 = buckets[lVar3]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (pppuVar7 != pppuVar11) {
        lVar18 = 8;
        uVar10 = 0;
        lVar12 = 8;
        bVar14 = 0;
        do {
          if (lVar12 != 0) {
            lVar13 = lVar12;
            uVar16 = uVar10;
            do {
              pppuVar11 = (pvVar1->_index_block).
                          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              pppuVar7 = (pvVar1->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              if (uVar16 == ((long)pppuVar7 - (long)pppuVar11 >> 3) - 1U) goto LAB_00207fe4;
              if (lVar18 != 0) {
                memmove(ppuVar15,pppuVar11[uVar16],lVar18 * 8);
              }
              uVar16 = uVar16 + 1;
              ppuVar15 = ppuVar15 + lVar18;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
            pppuVar11 = (pvVar1->_index_block).
                        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            pppuVar7 = (pvVar1->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          }
          uVar10 = uVar10 + lVar12;
          lVar12 = lVar12 << bVar14;
          bVar14 = bVar14 ^ 1;
          lVar18 = lVar18 << bVar14;
        } while (uVar10 < (ulong)((long)pppuVar7 - (long)pppuVar11 >> 3));
      }
LAB_00207fe4:
      __n = (long)pvVar1->_insertpos - (long)pppuVar7[-1];
      if (__n != 0) {
        memmove(ppuVar15,pppuVar7[-1],__n);
      }
      lVar9 = lVar9 + __ptr[lVar3];
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 0x10000) {
      lVar3 = 0;
      do {
        vector_brodnik<unsigned_char_*>::clear
                  ((vector_brodnik<unsigned_char_*> *)
                   ((long)&(buckets->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + 0x38;
      } while (lVar3 != 0x380000);
      lVar3 = *__ptr;
      lVar9 = 1;
      do {
        sVar17 = __ptr[lVar9];
        if (sVar17 != 0) {
          if ((char)lVar9 != '\0') {
            msd_D_adaptive<vector_brodnik<unsigned_char*>>(strings + lVar3,sVar17,depth + 2,buckets)
            ;
          }
          lVar3 = lVar3 + sVar17;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10000);
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}